

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.h
# Opt level: O3

bool __thiscall wasm::PossibleContents::isNull(PossibleContents *this)

{
  bool bVar1;
  Literal local_28;
  
  if (*(__index_type *)
       ((long)&(this->value).
               super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
               .
               super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
               .
               super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
               .
               super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
               .
               super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
               .
               super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
       + 0x18) == '\x01') {
    getLiteral(&local_28,this);
    bVar1 = wasm::Type::isNull(&local_28.type);
    Literal::~Literal(&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isNull() const { return isLiteral() && getLiteral().isNull(); }